

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cc
# Opt level: O1

unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
bssl::VerifyTrustStore::FromDER(string_view der_certs,string *out_diagnostic)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  TrustStoreInMemory *this;
  undefined8 *puVar4;
  long *plVar5;
  string *in_RCX;
  ulong uVar6;
  element_type *peVar7;
  char cVar8;
  char *pcVar9;
  __uniq_ptr_data<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>,_true,_true>
  _Var10;
  string *in_R8;
  ulong __val;
  Span<const_unsigned_char> cert_00;
  unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_> *ret;
  optional<std::shared_ptr<const_bssl::ParsedCertificate>_> parsed_cert;
  CBS cbs;
  string __str;
  CBS cert;
  _Storage<std::shared_ptr<const_bssl::ParsedCertificate>,_false> local_a8;
  char local_98;
  uchar *puStack_90;
  string *local_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  string *local_70;
  char *local_68;
  uchar *local_60;
  uint local_58;
  long local_50;
  anon_unknown_19 *local_40;
  uchar *local_38;
  
  pcVar9 = der_certs._M_str;
  _Var10.super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
  ._M_t.
  super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
  super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl =
       (__uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>)
       der_certs._M_len;
  local_88 = in_RCX;
  this = (TrustStoreInMemory *)operator_new(0x70);
  TrustStoreInMemory::TrustStoreInMemory(this);
  local_70 = out_diagnostic;
  local_68 = pcVar9;
  if (pcVar9 != (char *)0x0) {
    __val = 1;
    do {
      iVar3 = CBS_get_asn1_element
                        ((CBS *)&stack0xffffffffffffff90,(CBS *)&stack0xffffffffffffffc0,0x20000010)
      ;
      if (iVar3 == 0) {
        cVar8 = '\x01';
        if (__val < 10) goto LAB_004bf5aa;
        uVar6 = __val;
        cVar2 = '\x04';
        goto LAB_004bf56d;
      }
      cert_00.size_ = (size_t)local_88;
      cert_00.data_ = local_38;
      anon_unknown_19::InternalParseCertificate
                ((optional<std::shared_ptr<const_bssl::ParsedCertificate>_> *)&local_a8._M_value,
                 local_40,cert_00,in_R8);
      cVar8 = local_98;
      if (local_98 == '\0') {
        *(undefined8 *)
         _Var10.
         super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
         ._M_t.
         super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
         .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = 0;
      }
      else {
        local_80 = local_a8._M_value.
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        local_78._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8._M_value.
             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_a8._M_value.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_a8._M_value.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_a8._M_value.
                         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_a8._M_value.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_a8._M_value.
                         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 8) + 1;
          }
        }
        TrustStoreInMemory::AddTrustAnchor
                  (this,(shared_ptr<const_bssl::ParsedCertificate> *)&stack0xffffffffffffff80);
        if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
        }
      }
      if (local_98 == '\x01') {
        _local_98 = _local_98 & 0xffffffffffffff00;
        if (local_a8._M_value.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_a8._M_value.
                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (cVar8 == '\0') goto LAB_004bf67c;
      __val = __val + 1;
    } while (local_68 != (char *)0x0);
  }
  puVar4 = (undefined8 *)operator_new(8);
  *puVar4 = 0;
  *(undefined8 **)
   _Var10.
   super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>._M_t.
   super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
   super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = puVar4;
  *puVar4 = this;
  this = (TrustStoreInMemory *)0x0;
  goto LAB_004bf67c;
  while( true ) {
    if (uVar6 < 10000) goto LAB_004bf5aa;
    bVar1 = uVar6 < 100000;
    uVar6 = uVar6 / 10000;
    cVar2 = cVar8 + '\x04';
    if (bVar1) break;
LAB_004bf56d:
    cVar8 = cVar2;
    if (uVar6 < 100) {
      cVar8 = cVar8 + -2;
      goto LAB_004bf5aa;
    }
    if (uVar6 < 1000) {
      cVar8 = cVar8 + -1;
      goto LAB_004bf5aa;
    }
  }
  cVar8 = cVar8 + '\x01';
LAB_004bf5aa:
  local_60 = (uchar *)&stack0xffffffffffffffb0;
  ::std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffffa0,cVar8);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_60,local_58,__val);
  plVar5 = (long *)::std::__cxx11::string::replace
                             ((ulong)&stack0xffffffffffffffa0,0,(char *)0x0,0x5a7fa2);
  peVar7 = (element_type *)(plVar5 + 2);
  if ((element_type *)*plVar5 == peVar7) {
    _local_98 = (peVar7->cert_data_)._M_t.
                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
    puStack_90 = (uchar *)plVar5[3];
    local_a8._M_value.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&stack0xffffffffffffff68;
  }
  else {
    _local_98 = (peVar7->cert_data_)._M_t.
                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
    local_a8._M_value.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)*plVar5;
  }
  local_a8._M_value.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (__shared_count<(__gnu_cxx::_Lock_policy)2>)plVar5[1];
  *plVar5 = (long)peVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::__cxx11::string::operator=(local_88,(string *)&local_a8._M_value);
  if (local_a8._M_value.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&stack0xffffffffffffff68) {
    operator_delete(local_a8._M_value.
                    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(ulong)((long)_local_98 + 1));
  }
  if ((long *)local_60 != &stack0xffffffffffffffb0) {
    operator_delete(local_60,local_50 + 1);
  }
  *(undefined8 *)
   _Var10.
   super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>._M_t.
   super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
   super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl = 0;
LAB_004bf67c:
  if (this != (TrustStoreInMemory *)0x0) {
    (*(this->super_TrustStore).super_CertIssuerSource._vptr_CertIssuerSource[1])(this);
  }
  return (__uniq_ptr_data<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>,_true,_true>
          )(tuple<bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>)
           _Var10.
           super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
           .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<VerifyTrustStore> VerifyTrustStore::FromDER(
    std::string_view der_certs, std::string *out_diagnostic) {
  auto store = std::make_unique<TrustStoreInMemory>();
  CBS cbs = StringAsBytes(der_certs);

  for (size_t cert_num = 1; CBS_len(&cbs) != 0; cert_num++) {
    CBS cert;
    if (!CBS_get_asn1_element(&cbs, &cert, CBS_ASN1_SEQUENCE)) {
      *out_diagnostic = "failed to get ASN.1 SEQUENCE from input at cert " +
                        std::to_string(cert_num);
      return {};
    }

    auto parsed_cert = InternalParseCertificate(cert, out_diagnostic);
    if (!parsed_cert.has_value()) {
      return {};
    }
    store->AddTrustAnchor(parsed_cert.value());
  }

  return WrapTrustStore(std::move(store));
}